

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInteger.cpp
# Opt level: O1

int __thiscall BigIntegerLibrary::BigInteger::compare(BigInteger *this,BigInteger *other)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  bVar1 = this->isNegative;
  bVar2 = other->isNegative;
  uVar7 = 0xffffffff;
  if ((((~bVar1 | bVar2) & 1U) != 0) && (uVar7 = 1, ((~bVar2 | bVar1) & 1U) != 0)) {
    uVar7 = (byte)(bVar1 & bVar2) - 1 | 1;
    uVar8 = -(uint)(byte)(bVar1 & bVar2) | 1;
    piVar5 = (this->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
    piVar6 = (other->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(other->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
    if (uVar9 < uVar10) {
      return uVar8;
    }
    if (uVar9 <= uVar10) {
      uVar10 = uVar10 & 0xffffffff;
      do {
        if ((int)uVar10 < 1) {
          return 0;
        }
        iVar3 = piVar5[uVar10 - 1];
        iVar4 = piVar6[uVar10 - 1];
        if (iVar4 < iVar3) {
          return uVar8;
        }
        uVar10 = uVar10 - 1;
      } while (iVar4 <= iVar3);
    }
  }
  return uVar7;
}

Assistant:

int BigInteger::compare(const BigInteger& other) const {
        int sign = 1;
        if (isNegative && other.isNegative) {
            sign = -1;
        }
        if (isNegative && !other.isNegative) { // a < b
            return -1;
        }
        if (other.isNegative && !isNegative) { // a > b
            return 1;
        }
        if (num.size() > other.num.size()) { // a > b
            return sign;
        }
        if (num.size() < other.num.size()) { // a < b
            return -sign;
        }
        for (int i = (int) num.size() - 1; i >= 0; --i) {
            if (num[i] > other.num[i]) { // a > b
                return sign;
            }
            if (num[i] < other.num[i]) { // a < b
                return -sign;
            }
        }
        return 0; // a == b
    }